

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::findEI(Tokenizer *this,InputSource *input)

{
  size_t i;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  string *context;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  type ii;
  bool bVar11;
  bool bVar12;
  QPDFWordTokenFinder f;
  Tokenizer check;
  Finder local_128;
  InputSource *local_120;
  long *local_118 [2];
  long local_108 [2];
  qpdf_offset_t local_f8;
  Tokenizer *local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  Tokenizer local_c8;
  
  local_f0 = this;
  local_f8 = InputSource::getLastOffset(input);
  iVar5 = (*input->_vptr_InputSource[4])(input);
  bVar2 = false;
  do {
    if (bVar2) break;
    local_c8._0_8_ = (long)&local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"EI","");
    local_128._vptr_Finder = (_func_int **)&PTR__QPDFWordTokenFinder_002f31b0;
    local_120 = input;
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_c8._0_8_,
               local_c8._0_8_ + CONCAT44(local_c8._12_4_,local_c8.type));
    if ((void *)local_c8._0_8_ != (void *)((long)&local_c8 + 0x10U)) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8.val._M_dataplus._M_p + 1));
    }
    iVar6 = (*input->_vptr_InputSource[4])(input);
    bVar4 = InputSource::findFirst(input,"EI",CONCAT44(extraout_var_00,iVar6),0,&local_128);
    if (bVar4) {
      iVar6 = (*input->_vptr_InputSource[4])(input);
      lVar7 = CONCAT44(extraout_var_01,iVar6) - CONCAT44(extraout_var,iVar5);
      i = lVar7 - 2;
      if (lVar7 < 2) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
      }
      local_f0->inline_image_bytes = i;
      Tokenizer(&local_c8);
      bVar3 = false;
      bVar12 = false;
      uVar10 = 0;
      do {
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"checker","");
        nextToken(&local_c8,input,context,0);
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        if (local_c8.type == tt_bad) {
          bVar3 = true;
          bVar12 = true;
        }
        else if (local_c8.type == tt_word) {
          if (local_c8.raw_val._M_string_length != 0) {
            bVar8 = 0;
            bVar11 = false;
            bVar9 = 0;
            lVar7 = 0;
            do {
              bVar1 = local_c8.raw_val._M_dataplus._M_p[lVar7];
              if (((byte)(bVar1 + 0x9f) < 0x1a) || (bVar1 == 0x2a || (byte)(bVar1 + 0xbf) < 0x1a)) {
                bVar12 = false;
                bVar9 = 1;
              }
              else if (((char)bVar1 < ' ') &&
                      ((bVar12 = true, 0x20 < bVar1 ||
                       ((0x100003e01U >> ((ulong)bVar1 & 0x3f) & 1) == 0)))) {
                bVar11 = true;
              }
              else {
                bVar8 = 1;
                bVar12 = false;
              }
            } while ((!bVar12) &&
                    (bVar12 = local_c8.raw_val._M_string_length - 1 != lVar7, lVar7 = lVar7 + 1,
                    bVar12));
            if ((bool)(bVar9 & bVar8)) {
              bVar3 = true;
            }
            bVar12 = bVar3;
            if (bVar11) {
              bVar12 = true;
              bVar3 = true;
            }
          }
        }
        else if (local_c8.type == tt_eof) {
          bVar2 = true;
        }
      } while (((!bVar2) && (!bVar12)) && (bVar11 = uVar10 < 9, uVar10 = uVar10 + 1, bVar11));
      if (!bVar12) {
        bVar2 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.error_message._M_dataplus._M_p != &local_c8.error_message.field_2) {
        operator_delete(local_c8.error_message._M_dataplus._M_p,
                        local_c8.error_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.raw_val._M_dataplus._M_p != &local_c8.raw_val.field_2) {
        operator_delete(local_c8.raw_val._M_dataplus._M_p,
                        local_c8.raw_val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.val._M_dataplus._M_p != &local_c8.val.field_2) {
        operator_delete(local_c8.val._M_dataplus._M_p,local_c8.val.field_2._M_allocated_capacity + 1
                       );
      }
    }
    local_128._vptr_Finder = (_func_int **)&PTR__QPDFWordTokenFinder_002f31b0;
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
  } while (bVar4);
  (*input->_vptr_InputSource[5])(input,CONCAT44(extraout_var,iVar5),0);
  InputSource::setLastOffset(input,local_f8);
  return;
}

Assistant:

void
Tokenizer::findEI(InputSource& input)
{
    qpdf_offset_t last_offset = input.getLastOffset();
    qpdf_offset_t pos = input.tell();

    // Use QPDFWordTokenFinder to find EI surrounded by delimiters. Then read the next several
    // tokens or up to EOF. If we find any suspicious-looking or tokens, this is probably still part
    // of the image data, so keep looking for EI. Stop at the first EI that passes. If we get to the
    // end without finding one, return the last EI we found. Store the number of bytes expected in
    // the inline image including the EI and use that to break out of inline image, falling back to
    // the old method if needed.

    bool okay = false;
    bool first_try = true;
    while (!okay) {
        QPDFWordTokenFinder f(input, "EI");
        if (!input.findFirst("EI", input.tell(), 0, f)) {
            break;
        }
        inline_image_bytes = QIntC::to_size(input.tell() - pos - 2);

        Tokenizer check;
        bool found_bad = false;
        // Look at the next 10 tokens or up to EOF. The next inline image's image data would look
        // like bad tokens, but there will always be at least 10 tokens between one inline image's
        // EI and the next valid one's ID since width, height, bits per pixel, and color space are
        // all required as well as a BI and ID. If we get 10 good tokens in a row or hit EOF, we can
        // be pretty sure we've found the actual EI.
        for (int i = 0; i < 10; ++i) {
            check.nextToken(input, "checker");
            auto typ = check.getType();
            if (typ == tt::tt_eof) {
                okay = true;
            } else if (typ == tt::tt_bad) {
                found_bad = true;
            } else if (typ == tt::tt_word) {
                // The qpdf tokenizer lumps alphabetic and otherwise uncategorized characters into
                // "words". We recognize strings of alphabetic characters as potential valid
                // operators for purposes of telling whether we're in valid content or not. It's not
                // perfect, but it should work more reliably than what we used to do, which was
                // already good enough for the vast majority of files.
                bool found_alpha = false;
                bool found_non_printable = false;
                bool found_other = false;
                for (char ch: check.getValue()) {
                    if ((ch >= 'a' && ch <= 'z') || (ch >= 'A' && ch <= 'Z') || (ch == '*')) {
                        // Treat '*' as alpha since there are valid PDF operators that contain *
                        // along with alphabetic characters.
                        found_alpha = true;
                    } else if (static_cast<signed char>(ch) < 32 && !isSpace(ch)) {
                        // Compare ch as a signed char so characters outside of 7-bit will be < 0.
                        found_non_printable = true;
                        break;
                    } else {
                        found_other = true;
                    }
                }
                if (found_non_printable || (found_alpha && found_other)) {
                    found_bad = true;
                }
            }
            if (okay || found_bad) {
                break;
            }
        }
        if (!found_bad) {
            okay = true;
        }
        if (!okay) {
            first_try = false;
        }
    }
    if (okay && (!first_try)) {
        QTC::TC("qpdf", "QPDFTokenizer found EI after more than one try");
    }

    input.seek(pos, SEEK_SET);
    input.setLastOffset(last_offset);
}